

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.h
# Opt level: O3

Matrix<std::complex<float>_> * __thiscall
webrtc::Matrix<std::complex<float>_>::Add
          (Matrix<std::complex<float>_> *this,Matrix<std::complex<float>_> *operand)

{
  _ComplexT _Var1;
  string *result;
  pointer pcVar2;
  ulong uVar3;
  int line;
  FatalMessage FStack_188;
  
  if (this->num_rows_ != operand->num_rows_) {
    result = rtc::MakeCheckOpString<unsigned_long,unsigned_long>
                       (&this->num_rows_,&operand->num_rows_,"num_rows_ == operand.num_rows_");
    if (result != (string *)0x0) {
      line = 0xa2;
      goto LAB_00177598;
    }
  }
  if (this->num_columns_ != operand->num_columns_) {
    result = rtc::MakeCheckOpString<unsigned_long,unsigned_long>
                       (&this->num_columns_,&operand->num_columns_,
                        "num_columns_ == operand.num_columns_");
    if (result != (string *)0x0) {
      line = 0xa3;
LAB_00177598:
      rtc::FatalMessage::FatalMessage
                (&FStack_188,
                 "/workspace/llm4binary/github/license_c_cmakelists/ctwgL[P]webrtc-beamforming/webrtc/webrtc/modules/audio_processing/beamformer/matrix.h"
                 ,line,result);
      rtc::FatalMessage::~FatalMessage(&FStack_188);
    }
  }
  pcVar2 = (this->data_).
           super__Vector_base<std::complex<float>,_std::allocator<std::complex<float>_>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->data_).super__Vector_base<std::complex<float>,_std::allocator<std::complex<float>_>_>.
      _M_impl.super__Vector_impl_data._M_finish != pcVar2) {
    uVar3 = 0;
    do {
      _Var1 = (operand->data_).
              super__Vector_base<std::complex<float>,_std::allocator<std::complex<float>_>_>._M_impl
              .super__Vector_impl_data._M_start[uVar3]._M_value;
      pcVar2[uVar3]._M_value =
           CONCAT44((float)(pcVar2[uVar3]._M_value >> 0x20) + (float)(_Var1 >> 0x20),
                    (float)pcVar2[uVar3]._M_value + (float)_Var1);
      uVar3 = uVar3 + 1;
      pcVar2 = (this->data_).
               super__Vector_base<std::complex<float>,_std::allocator<std::complex<float>_>_>.
               _M_impl.super__Vector_impl_data._M_start;
    } while (uVar3 < (ulong)((long)(this->data_).
                                   super__Vector_base<std::complex<float>,_std::allocator<std::complex<float>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish - (long)pcVar2 >> 3));
  }
  return this;
}

Assistant:

Matrix& Add(const Matrix& operand) {
    RTC_CHECK_EQ(num_rows_, operand.num_rows_);
    RTC_CHECK_EQ(num_columns_, operand.num_columns_);

    for (size_t i = 0; i < data_.size(); ++i) {
      data_[i] += operand.data_[i];
    }

    return *this;
  }